

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteInvalidModule
          (BinaryWriterSpec *this,ScriptModule *module,string_view text)

{
  ScriptModuleType SVar1;
  string_view s;
  string_view filename_00;
  int iVar2;
  undefined4 extraout_var;
  Stream *this_00;
  char *pcVar3;
  string_view sVar4;
  string filename;
  char *in_stack_ffffffffffffff78;
  char *pcVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  char *local_60;
  size_type local_58;
  string local_50;
  
  local_58 = text.size_;
  local_60 = text.data_;
  SVar1 = module->type_;
  if (SVar1 == Quoted) {
    pcVar5 = "text";
    pcVar3 = kWatExtension;
  }
  else if ((SVar1 == Binary) || (SVar1 == Text)) {
    pcVar5 = "binary";
    pcVar3 = kWasmExtension;
  }
  else {
    pcVar3 = "";
    pcVar5 = "";
  }
  iVar2 = (*module->_vptr_ScriptModule[2])(module);
  Stream::Writef(this->json_stream_,"\"%s\": ","line");
  Stream::Writef(this->json_stream_,"%d",(ulong)*(uint *)(CONCAT44(extraout_var,iVar2) + 0x10));
  Stream::Writef(this->json_stream_,", ");
  (anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_(&local_50,this,pcVar3);
  Stream::Writef(this->json_stream_,"\"%s\": ","filename");
  sVar4.size_ = (size_type)pcVar5;
  sVar4.data_ = in_stack_ffffffffffffff78;
  sVar4 = GetBasename(sVar4);
  WriteEscapedString(this,sVar4);
  Stream::Writef(this->json_stream_,", ");
  Stream::Writef(this->json_stream_,"\"%s\": ","text");
  s.size_ = local_58;
  s.data_ = local_60;
  WriteEscapedString(this,s);
  Stream::Writef(this->json_stream_,", ");
  Stream::Writef(this->json_stream_,"\"%s\": ","module_type");
  Stream::Writef(this->json_stream_,"\"%s\"",pcVar5);
  filename_00.size_ = local_50._M_string_length;
  filename_00.data_ = local_50._M_dataplus._M_p;
  SVar1 = module->type_;
  if (SVar1 == Quoted) {
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_50._M_dataplus._M_p;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_50._M_string_length;
    if ((this->module_stream_factory_).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_00146bfc:
      std::__throw_bad_function_call();
    }
    this_00 = (*(this->module_stream_factory_)._M_invoker)
                        ((_Any_data *)&this->module_stream_factory_,(string_view *)&local_78);
    if (module->type_ != Quoted) {
      pcVar3 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::DataScriptModule<wabt::ScriptModuleType::Quoted>, Base = wabt::ScriptModule]"
      ;
LAB_00146c16:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h"
                    ,0x48,pcVar3);
    }
  }
  else {
    if (SVar1 != Binary) {
      if (SVar1 == Text) {
        WriteModule(this,filename_00,(Module *)(module + 1));
      }
      goto LAB_00146bda;
    }
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_50._M_dataplus._M_p;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_50._M_string_length;
    if ((this->module_stream_factory_).super__Function_base._M_manager == (_Manager_type)0x0)
    goto LAB_00146bfc;
    this_00 = (*(this->module_stream_factory_)._M_invoker)
                        ((_Any_data *)&this->module_stream_factory_,(string_view *)&local_78);
    if (module->type_ != Binary) {
      pcVar3 = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::DataScriptModule<wabt::ScriptModuleType::Binary>, Base = wabt::ScriptModule]"
      ;
      goto LAB_00146c16;
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_78,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(module + 5));
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    Stream::WriteData(this_00,local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,"",No);
  }
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
LAB_00146bda:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BinaryWriterSpec::WriteInvalidModule(const ScriptModule& module,
                                          string_view text) {
  const char* extension = "";
  const char* module_type = "";
  switch (module.type()) {
    case ScriptModuleType::Text:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Binary:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Quoted:
      extension = kWatExtension;
      module_type = "text";
      break;
  }

  WriteLocation(module.location());
  WriteSeparator();
  std::string filename = GetModuleFilename(extension);
  WriteKey("filename");
  WriteEscapedString(GetBasename(filename));
  WriteSeparator();
  WriteKey("text");
  WriteEscapedString(text);
  WriteSeparator();
  WriteKey("module_type");
  WriteString(module_type);
  WriteScriptModule(filename, module);
}